

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O2

void __thiscall FileInputSource::seek(FileInputSource *this,qpdf_offset_t offset,int whence)

{
  int iVar1;
  allocator<char> local_141;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = QUtil::seek(this->file,offset,whence);
  if (iVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"seek to ",&local_141);
    std::operator+(&local_100,&local_40,&this->filename);
    std::operator+(&local_e0,&local_100,", offset ");
    std::__cxx11::to_string(&local_120,offset);
    std::operator+(&local_c0,&local_e0,&local_120);
    std::operator+(&local_a0,&local_c0," (");
    std::__cxx11::to_string(&local_140,whence);
    std::operator+(&local_80,&local_a0,&local_140);
    std::operator+(&local_60,&local_80,")");
    QUtil::throw_system_error(&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void
FileInputSource::seek(qpdf_offset_t offset, int whence)
{
    if (QUtil::seek(this->file, offset, whence) == -1) {
        QUtil::throw_system_error(
            std::string("seek to ") + this->filename + ", offset " + std::to_string(offset) + " (" +
            std::to_string(whence) + ")");
    }
}